

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O1

void __thiscall zstr::ifstream::ifstream(ifstream *this)

{
  undefined1 *this_00;
  istreambuf *this_01;
  
  std::ios_base::ios_base((ios_base *)&this->field_0x218);
  *(code **)&this->field_0x218 = std::__cxx11::string::string;
  *(undefined8 *)&this->field_0x2f0 = 0;
  *(undefined2 *)&this->field_0x2f8 = 0;
  *(undefined8 *)&this->field_0x300 = 0;
  *(undefined8 *)&this->field_0x308 = 0;
  *(undefined8 *)&this->field_0x310 = 0;
  *(undefined8 *)&this->field_0x318 = 0;
  this_00 = &(this->super_istream).field_0x10;
  memset(this_00,0,0x208);
  strict_fstream::ifstream::ifstream((ifstream *)this_00);
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x448240;
  *(undefined8 *)&this->field_0x218 = 0x448268;
  this_01 = (istreambuf *)operator_new(0x80);
  istreambuf::istreambuf(this_01,(streambuf *)&(this->super_istream).field_0x20,0x100000,true,0);
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x4482b0;
  *(undefined8 *)&this->field_0x218 = 0x4482d8;
  (this->super_istream)._M_gcount = 0;
  std::ios::init((streambuf *)&this->field_0x218);
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x448240;
  *(undefined8 *)&this->field_0x218 = 0x448268;
  return;
}

Assistant:

explicit ifstream()
      : detail::strict_fstream_holder<strict_fstream::ifstream>(),
        std::istream(new istreambuf(_fs.rdbuf())) {}